

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::GenEnumValDecl
          (string *__return_storage_ptr__,CppGenerator *this,EnumDef *enum_def,string *enum_val)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  if ((this->opts_).super_IDLOptions.prefixed_enums == true) {
    EscapeKeyword(&local_38,this,(string *)enum_def);
    std::operator+(&bStack_58,&local_38,"_");
    std::operator+(__return_storage_ptr__,&bStack_58,enum_val);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)enum_val);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenEnumValDecl(const EnumDef &enum_def,
                             const std::string &enum_val) const {
    return opts_.prefixed_enums ? Name(enum_def) + "_" + enum_val : enum_val;
  }